

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O0

bool jsoncons::bson::detail::dec128_istreq(char *a,char *lasta,char *b,char *lastb)

{
  char cVar1;
  char cVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long local_20;
  long local_10;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  while( true ) {
    if (local_10 == in_RSI && local_20 == in_RCX) {
      return true;
    }
    if ((local_10 == in_RSI) || (local_20 == in_RCX)) break;
    cVar1 = dec128_tolower('\0');
    cVar2 = dec128_tolower('\0');
    if (cVar1 != cVar2) {
      return false;
    }
    local_10 = local_10 + 1;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

inline
        bool dec128_istreq (const char* a, const char* lasta,
                            const char* b, const char* lastb)
        {
            while (!(a == lasta && b == lastb)) 
            {
               // strings are different lengths
               if (a == lasta || b == lastb) 
               {
                  return false;
               }
         
               if (dec128_tolower (*a) != dec128_tolower (*b)) {
                  return false;
               }
         
               a++;
               b++;
            }
         
            return true;
        }